

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmatrix.c
# Opt level: O2

Boolean Q_KerDefined(QMatrix *Q)

{
  double dVar1;
  LASErrIdType LVar2;
  Boolean BVar3;
  Boolean BVar4;
  
  LVar2 = LASResult();
  BVar3 = False;
  BVar4 = False;
  if (((LVar2 == LASOK) &&
      (((Q->UnitRightKer != False || (Q->RightKerCmp != (Real *)0x0)) &&
       (dVar1 = Q->MultiplD, BVar4 = BVar3, 2.2250738585072014e-307 <= ABS(dVar1))))) &&
     ((ABS(Q->MultiplU / dVar1 + -1.0) < 2.220446049250313e-15 &&
      (ABS(Q->MultiplL / dVar1 + -1.0) < 2.220446049250313e-15)))) {
    BVar4 = True;
  }
  return BVar4;
}

Assistant:

Boolean Q_KerDefined(QMatrix *Q)
/* returns True if Q is singular and the null space has been defined
   otherwise False */ 
{
    Boolean KerDefined;

    if (LASResult() == LASOK) {
        if ((Q->UnitRightKer || Q->RightKerCmp != NULL) && !IsZero(Q->MultiplD)
	    && IsOne(Q->MultiplU / Q->MultiplD) && IsOne(Q->MultiplL / Q->MultiplD))
	    KerDefined = True;
	else
	    KerDefined = False;
    } else {
        KerDefined = (Boolean)0;
    }
    return(KerDefined);
}